

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O2

Index * getIndex(string *threadId)

{
  Index *pIVar1;
  Index newIndex;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  Index local_178;
  Index local_110;
  pair<Thread,_std::vector<Comment,_std::allocator<Comment>_>_> local_a8;
  
  local_198._8_8_ = 0;
  local_180 = std::
              _Function_handler<bool_(const_Index_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/src/StdBot.cpp:22:37)>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<bool_(const_Index_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/src/StdBot.cpp:22:37)>
              ::_M_manager;
  local_198._M_unused._M_object = threadId;
  pIVar1 = Cache<Index>::find(&threadCache,(function<bool_(const_Index_&)> *)&local_198);
  std::_Function_base::~_Function_base((_Function_base *)&local_198);
  if (pIVar1 == (Index *)0x0) {
    Reddit::requestThread(&local_a8,reddit,threadId);
    Index::Index(&local_110,&local_a8.first,&local_a8.second);
    Index::Index(&local_178,&local_110);
    pIVar1 = Cache<Index>::add(&threadCache,&local_178);
    Index::~Index(&local_178);
    Index::~Index(&local_110);
    std::pair<Thread,_std::vector<Comment,_std::allocator<Comment>_>_>::~pair(&local_a8);
  }
  return pIVar1;
}

Assistant:

Index* getIndex(const std::string& threadId) {
    Index* index = threadCache.find([&](const Index& i) {
        return i.getThreadId() == threadId;
    });

    if (index == nullptr) {
        const auto& [thread, commentList] = reddit->requestThread(threadId);
        Index newIndex(thread, commentList);
        index = threadCache.add(newIndex);
    }

    return index;
}